

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O2

string * __thiscall
higan::LogFile::GetFileName_abi_cxx11_(string *__return_storage_ptr__,LogFile *this)

{
  tm *__tp;
  char local_68 [8];
  char buffer [32];
  time_t local_28;
  time_t now;
  
  local_28 = time((time_t *)0x0);
  __tp = localtime(&local_28);
  strftime(local_68,0x20,".%Y%m%d-%H%M%S.",__tp);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (buffer + 0x18),&this->log_dir_,"/");
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (buffer + 0x18),&this->log_prefix_);
  std::__cxx11::string::~string((string *)(buffer + 0x18));
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string LogFile::GetFileName()
{
	time_t now = time(nullptr);

	struct tm* tm_now = localtime(&now);

	char buffer[32];

	strftime(buffer, sizeof buffer, ".%Y%m%d-%H%M%S.", tm_now);

	std::string result_name = log_dir_ + "/" + log_prefix_;
	result_name.append(buffer);
	result_name += "log";

	return result_name;
}